

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O1

void __thiscall
chrono::copter::Copter<6>::AddVisualizationAssets
          (Copter<6> *this,string *chassismesh,string *propellermesh,ChFrame<double> *cor_m1,
          ChFrame<double> *cor_m2)

{
  element_type *peVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChColor *pCVar3;
  string *size;
  pointer psVar4;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_prop_shape;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> prop_trimesh;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  ChColor *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  ChColor *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ChColor *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined8 local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  ChFrame<double> *local_50;
  string *local_48;
  undefined8 local_3c;
  undefined4 local_34;
  
  local_50 = cor_m2;
  local_48 = propellermesh;
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_60,SUB81(chassismesh,0),true);
  pCVar3 = (ChColor *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)chassismesh);
  chrono::ChTriangleMeshShape::ChTriangleMeshShape((ChTriangleMeshShape *)pCVar3);
  local_c0 = pCVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&local_b8,(ChTriangleMeshShape *)pCVar3);
  local_70 = local_60;
  local_68 = local_58;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  chrono::ChTriangleMeshShape::SetMesh(local_c0,&local_70,1);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  *(undefined1 *)((long)&local_c0->B + 1) = 0;
  local_b0 = 0x3ea3d70a3e4ccccd;
  local_a8 = 0x3ef5c28f;
  chrono::ChVisualShape::SetColor(local_c0);
  peVar1 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80 = local_c0;
  local_78 = local_b8._M_pi;
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChPhysicsItem::AddVisualShape(peVar1,&local_80,cor_m1);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  psVar2 = (this->props).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  size = local_48;
  for (psVar4 = (this->props).
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_start; local_48 = size, psVar4 != psVar2;
      psVar4 = psVar4 + 1) {
    peVar1 = (psVar4->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar4->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&local_b0,SUB81(size,0),true);
    pCVar3 = (ChColor *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
    chrono::ChTriangleMeshShape::ChTriangleMeshShape((ChTriangleMeshShape *)pCVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
              (&local_c8,(ChTriangleMeshShape *)pCVar3);
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a4,local_a8);
    local_90 = local_b0;
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_88->_M_use_count = local_88->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_88->_M_use_count = local_88->_M_use_count + 1;
      }
    }
    chrono::ChTriangleMeshShape::SetMesh(pCVar3,&local_90,1);
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
    *(undefined1 *)((long)&pCVar3->B + 1) = 0;
    local_3c = 0x3f2e147b3f4ccccd;
    local_34 = 0x3f051eb8;
    chrono::ChVisualShape::SetColor(pCVar3);
    local_98 = local_c8._M_pi;
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
      }
    }
    local_a0 = pCVar3;
    chrono::ChPhysicsItem::AddVisualShape(peVar1,&local_a0,local_50);
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a4,local_a8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a4,local_a8));
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    size = local_48;
  }
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void Copter<nop>::AddVisualizationAssets(const std::string& chassismesh,
                                         const std::string& propellermesh,
                                         const ChFrame<>& cor_m1,
                                         const ChFrame<>& cor_m2) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(chassismesh, true, true);
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetMutable(false);
    trimesh_shape->SetColor(ChColor(0.2f, 0.32f, 0.48f));
    chassis->AddVisualShape(trimesh_shape, cor_m1);

    for (auto propeller : props) {
        auto prop_trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(propellermesh, true, true);
        auto trimesh_prop_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_prop_shape->SetMesh(prop_trimesh);
        trimesh_prop_shape->SetMutable(false);
        trimesh_prop_shape->SetColor(ChColor(0.8f, 0.68f, 0.52f));
        propeller->AddVisualShape(trimesh_prop_shape, cor_m2);
    }
}